

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermediate.h
# Opt level: O2

void __thiscall glslang::TIntermAggregate::TIntermAggregate(TIntermAggregate *this)

{
  TIntermOperator::TIntermOperator(&this->super_TIntermOperator,EOpNull);
  (this->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode =
       (_func_int **)&PTR_getLoc_008a1690;
  TVector<TIntermNode_*>::TVector(&this->sequence);
  TVector<glslang::TStorageQualifier>::TVector(&this->qualifier);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  basic_string(&this->name);
  this->userDefined = false;
  this->pragmaTable = (TPragmaTable *)0x0;
  TSpirvInstruction::TSpirvInstruction(&this->spirvInst);
  this->linkType = ELinkNone;
  (this->endLoc).name = (TString *)0x0;
  (this->endLoc).string = 0;
  (this->endLoc).line = 0;
  (this->endLoc).column = 0;
  return;
}

Assistant:

TIntermAggregate() : TIntermOperator(EOpNull), userDefined(false), pragmaTable(nullptr) { 
        endLoc.init();
    }